

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleConfigLoader.cpp
# Opt level: O0

char * __thiscall SimpleConfigLoader::trimString(SimpleConfigLoader *this,char *text)

{
  int iVar1;
  size_t sVar2;
  char *in_RSI;
  bool bVar3;
  char *trimmedText;
  int length;
  int endPos;
  int startPos;
  int local_20;
  int local_1c;
  char *local_8;
  
  if (in_RSI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    local_1c = 0;
    sVar2 = strlen(in_RSI);
    local_20 = (int)sVar2 + -1;
    while( true ) {
      bVar3 = false;
      if (local_1c <= local_20) {
        iVar1 = isspace((int)in_RSI[local_1c]);
        bVar3 = iVar1 != 0;
      }
      if (!bVar3) break;
      local_1c = local_1c + 1;
    }
    while( true ) {
      bVar3 = false;
      if (local_1c <= local_20) {
        iVar1 = isspace((int)in_RSI[local_20]);
        bVar3 = iVar1 != 0;
      }
      if (!bVar3) break;
      local_20 = local_20 + -1;
    }
    iVar1 = (local_20 - local_1c) + 1;
    if (iVar1 < 1) {
      local_8 = (char *)0x0;
    }
    else {
      local_8 = (char *)malloc((long)((local_20 - local_1c) + 2));
      if (local_8 == (char *)0x0) {
        local_8 = (char *)0x0;
      }
      else {
        local_8[iVar1] = '\0';
        memcpy(local_8,in_RSI + local_1c,(long)iVar1);
      }
    }
  }
  return local_8;
}

Assistant:

char* SimpleConfigLoader::trimString(char* text)
{
	if (text == NULL)
	{
		return NULL;
	}

	int startPos = 0;
	int endPos = strlen(text) - 1;

	// Find the first position without a space
	while (startPos <= endPos && isspace((int)*(text + startPos)))
	{
		startPos++;
	}
	// Find the last position without a space
	while (startPos <= endPos && isspace((int)*(text + endPos)))
	{
		endPos--;
	}

	// We must have a valid string
	int length = endPos - startPos + 1;
	if (length <= 0)
	{
		return NULL;
	}

	// Create the trimmed text
	char* trimmedText = (char*)malloc(length + 1);
	if (trimmedText == NULL)
	{
		return NULL;
	}
	trimmedText[length] = '\0';
	memcpy(trimmedText, text + startPos, length);

	return trimmedText;
}